

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O2

PSNodesSeq * __thiscall
dg::pta::LLVMPointerGraphBuilder::createMemSet
          (PSNodesSeq *__return_storage_ptr__,LLVMPointerGraphBuilder *this,Instruction *Inst)

{
  bool bVar1;
  undefined8 *puVar2;
  Use *pUVar3;
  Value *val;
  PSNode *n;
  PSNode *op;
  PSNode *G;
  PSNode *local_38;
  PSNode *local_30;
  PSNode *local_28;
  
  bVar1 = llvmutils::memsetIsZeroInitialization((IntrinsicInst *)Inst);
  if (bVar1) {
    puVar2 = (undefined8 *)&NULLPTR;
  }
  else {
    puVar2 = &UNKNOWN_MEMORY;
  }
  local_28 = (PSNode *)*puVar2;
  pUVar3 = llvm::User::getOperandList((User *)Inst);
  val = (Value *)llvm::Value::stripInBoundsOffsets
                           (*(undefined8 *)pUVar3,
                            llvm::function_ref<void(llvm::Value_const*)>::
                            callback_fn<llvm::Value::stripInBoundsOffsets(llvm::function_ref<void(llvm::Value_const*)>)::_default_arg_1_::_lambda(llvm::Value_const*)_1_>
                            ,&local_38);
  local_38 = getOperand(this,val);
  local_30 = PointerGraph::create<(dg::pta::PSNodeType)4,dg::pta::PSNode*&,unsigned_long_const&>
                       ((PointerGraph *)this,&local_38,&Offset::UNKNOWN);
  n = PointerGraph::create<(dg::pta::PSNodeType)3,dg::pta::PSNode*&,dg::pta::PSNode*&>
                ((PointerGraph *)this,&local_28,&local_30);
  PSNodesSeq::PSNodesSeq(__return_storage_ptr__,local_30);
  PSNodesSeq::append(__return_storage_ptr__,n);
  return __return_storage_ptr__;
}

Assistant:

LLVMPointerGraphBuilder::PSNodesSeq
LLVMPointerGraphBuilder::createMemSet(const llvm::Instruction *Inst) {
    PSNode *val;
    if (llvmutils::memsetIsZeroInitialization(
                llvm::cast<llvm::IntrinsicInst>(Inst)))
        val = NULLPTR;
    else
        // if the memset is not 0-initialized, it does some
        // garbage into the pointer
        val = UNKNOWN_MEMORY;

    PSNode *op = getOperand(Inst->getOperand(0)->stripInBoundsOffsets());
    // we need to make unknown offsets
    PSNode *G = PS.create<PSNodeType::GEP>(op, Offset::UNKNOWN);
    PSNode *S = PS.create<PSNodeType::STORE>(val, G);

    PSNodesSeq ret(G);
    ret.append(S);
    // no representant here...

    return ret;
}